

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Finger.cpp
# Opt level: O2

void __thiscall Finger::stabilize(Finger *this,Filter *f)

{
  Point PVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  vector<float,_std::allocator<float>_> prd;
  _Vector_base<float,_std::allocator<float>_> local_28;
  
  Filter::predict((vector<float,_std::allocator<float>_> *)&local_28,f);
  fVar2 = local_28._M_impl.super__Vector_impl_data._M_start[1];
  fVar3 = local_28._M_impl.super__Vector_impl_data._M_start[2];
  fVar4 = local_28._M_impl.super__Vector_impl_data._M_start[3];
  (this->ptStart).x = (int)*local_28._M_impl.super__Vector_impl_data._M_start;
  (this->ptStart).y = (int)fVar2;
  (this->ptEnd).x = (int)fVar3;
  (this->ptEnd).y = (int)fVar4;
  PVar1.y = (int)(float)((ulong)*(undefined8 *)
                                 (local_28._M_impl.super__Vector_impl_data._M_start + 4) >> 0x20);
  PVar1.x = (int)(float)*(undefined8 *)(local_28._M_impl.super__Vector_impl_data._M_start + 4);
  this->ptFar = PVar1;
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

void Finger::stabilize(Filter &f) {
    vector<float> prd = f.predict();
    ptStart.x = prd[0];
    ptStart.y = prd[1];
    ptEnd.x = prd[2];
    ptEnd.y = prd[3];
    ptFar.x = prd[4];
    ptFar.y = prd[5];
}